

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  ImDrawCmd *pIVar1;
  float fVar2;
  char cVar3;
  ushort uVar4;
  ImDrawVert *__src;
  unsigned_short *__src_00;
  bool bVar5;
  ImDrawIdx *pIVar6;
  ImDrawVert *pIVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  ImFontGlyph *pIVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  ImDrawIdx IVar16;
  char *pcVar17;
  char *pcVar18;
  int iVar19;
  char *pcVar20;
  float fVar21;
  undefined1 auVar22 [4];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  uint c;
  float local_b4;
  uint local_a4;
  ImVec4 *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  ImDrawIdx *local_80;
  ImDrawVert *local_78;
  int local_70;
  int local_6c;
  ImU32 local_68;
  float local_64;
  ulong local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [4];
  undefined1 auStack_44 [8];
  float fStack_3c;
  
  auVar22 = (undefined1  [4])pos.x;
  fVar21 = pos.y;
  local_68 = col;
  if (text_end == (char *)0x0) {
    auStack_44._4_4_ = in_XMM1_Dc;
    _local_48 = pos;
    fStack_3c = in_XMM1_Dd;
    sVar9 = strlen(text_begin);
    text_end = text_begin + sVar9;
    auVar22 = local_48;
    fVar21 = (float)auStack_44._0_4_;
    in_XMM1_Dc = (float)auStack_44._4_4_;
    in_XMM1_Dd = fStack_3c;
  }
  fStack_94 = (float)(int)fVar21;
  fStack_90 = (float)(int)fVar21;
  fStack_8c = (float)(int)fVar21;
  local_98 = (float)(int)fVar21 + (this->DisplayOffset).y;
  if (local_98 < clip_rect->w || local_98 == clip_rect->w) {
    fStack_54 = (float)(int)fVar21;
    fStack_50 = (float)(int)in_XMM1_Dc;
    fStack_4c = (float)(int)in_XMM1_Dd;
    fVar21 = size / this->FontSize;
    fVar26 = this->FontSize * fVar21;
    pcVar20 = text_begin;
    if ((wrap_width <= 0.0) && (text_begin < text_end && local_98 + fVar26 < clip_rect->y)) {
      do {
        pcVar20 = text_begin;
        if (*text_begin == '\n') break;
        text_begin = text_begin + 1;
        pcVar20 = text_end;
      } while (text_begin != text_end);
    }
    local_58 = (float)(int)(float)auVar22 + (this->DisplayOffset).x;
    iVar8 = (int)text_end - (int)pcVar20;
    local_6c = iVar8 * 6;
    local_70 = (draw_list->IdxBuffer).Size;
    local_a0 = clip_rect;
    ImDrawList::PrimReserve(draw_list,local_6c,iVar8 * 4);
    local_78 = draw_list->_VtxWritePtr;
    local_80 = draw_list->_IdxWritePtr;
    local_60 = (ulong)draw_list->_VtxCurrentIdx;
    pcVar10 = (char *)0x0;
    fVar27 = local_58;
    fVar34 = local_58;
    auVar22 = (undefined1  [4])local_98;
    fVar23 = fStack_94;
    fVar24 = fStack_90;
    fVar25 = fStack_8c;
    fVar2 = local_64;
    fVar32 = local_58;
    pcVar17 = (char *)0x0;
    pcVar14 = pcVar20;
joined_r0x001837f1:
    do {
      local_64 = fVar27;
      if (text_end <= pcVar20) break;
      pcVar15 = pcVar14;
      pcVar18 = pcVar17;
      local_b4 = fVar32;
      fVar27 = local_98;
      fVar31 = fStack_94;
      fVar30 = fStack_90;
      fVar28 = fStack_8c;
      if (0.0 < wrap_width) {
        local_b4 = local_64;
        if (pcVar10 == (char *)0x0) {
          local_48 = auVar22;
          pcVar10 = CalcWordWrapPositionA
                              (this,fVar21,pcVar20,text_end,(fVar34 - local_64) + wrap_width);
          fVar23 = 0.0;
          fVar24 = 0.0;
          fVar25 = 0.0;
          pcVar10 = pcVar10 + (pcVar10 == pcVar20);
          auVar22 = local_48;
          local_b4 = local_64;
          fVar34 = local_58;
          fVar2 = local_64;
        }
        local_64 = fVar2;
        pcVar15 = pcVar20;
        pcVar18 = pcVar10;
        fVar27 = (float)auVar22;
        fVar31 = fVar23;
        fVar30 = fVar24;
        fVar28 = fVar25;
        fVar2 = local_64;
        if (pcVar10 <= pcVar20) {
          do {
            if (text_end <= pcVar20) break;
            cVar3 = *pcVar20;
            pcVar20 = pcVar20 + ((byte)(cVar3 - 9U) < 2 || cVar3 == ' ');
          } while ((cVar3 == ' ') || (cVar3 == '\t'));
          pcVar10 = (char *)0x0;
          fVar27 = fVar34;
          auVar22 = (undefined1  [4])((float)auVar22 + fVar26);
          goto joined_r0x001837f1;
        }
      }
      local_64 = fVar2;
      fStack_8c = fVar28;
      fStack_90 = fVar30;
      fStack_94 = fVar31;
      local_98 = fVar27;
      local_a4 = (uint)*pcVar15;
      if (*pcVar15 < '\0') {
        iVar8 = ImTextCharFromUtf8(&local_a4,pcVar15,text_end);
        pcVar15 = pcVar15 + iVar8;
        fVar34 = local_58;
        if (local_a4 != 0) goto LAB_00183925;
        bVar5 = true;
        pcVar20 = pcVar15;
        fVar32 = local_b4;
      }
      else {
        pcVar15 = pcVar15 + 1;
LAB_00183925:
        pcVar20 = pcVar15;
        if (local_a4 < 0x20) {
          if (local_a4 != 0xd) {
            if (local_a4 == 10) {
              local_98 = local_98 + fVar26;
              bVar5 = true;
              fVar32 = fVar34;
              if (local_98 < local_a0->w || local_98 == local_a0->w) {
                if (wrap_width <= 0.0) {
                  bVar5 = false;
                  if ((fVar26 + local_98 < local_a0->y) && (pcVar15 < text_end)) {
                    lVar12 = (long)text_end - (long)pcVar15;
                    do {
                      if (*pcVar15 == '\n') goto LAB_0018396a;
                      pcVar15 = pcVar15 + 1;
                      bVar5 = false;
                      lVar12 = lVar12 + -1;
                      pcVar20 = text_end;
                    } while (lVar12 != 0);
                  }
                }
                else {
LAB_0018396a:
                  bVar5 = false;
                  pcVar20 = pcVar15;
                }
              }
              goto LAB_00183ac3;
            }
            goto LAB_00183975;
          }
        }
        else {
LAB_00183975:
          if (((int)(local_a4 & 0xffff) < (this->IndexLookup).Size) &&
             (uVar4 = (this->IndexLookup).Data[local_a4 & 0xffff], uVar4 != 0xffff)) {
            pIVar11 = (ImFontGlyph *)
                      ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar4 * 0x28));
          }
          else {
            pIVar11 = this->FallbackGlyph;
          }
          bVar5 = true;
          if (pIVar11 == (ImFontGlyph *)0x0) {
            fVar23 = 0.0;
          }
          else {
            fVar23 = pIVar11->AdvanceX * fVar21;
            if ((local_a4 != 9) && (local_a4 != 0x20)) {
              fVar25 = pIVar11->X0 * fVar21 + local_b4;
              fVar24 = local_a0->z;
              if (fVar25 <= fVar24) {
                fVar32 = pIVar11->X1 * fVar21 + local_b4;
                fVar2 = local_a0->x;
                if (fVar2 <= fVar32) {
                  fVar33 = pIVar11->Y0 * fVar21 + local_98;
                  fVar29 = pIVar11->Y1 * fVar21 + local_98;
                  fVar27 = pIVar11->U0;
                  fVar31 = pIVar11->V0;
                  fVar30 = pIVar11->U1;
                  fVar28 = pIVar11->V1;
                  if (cpu_fine_clip) {
                    if (fVar25 < fVar2) {
                      fVar27 = fVar27 + (fVar30 - fVar27) *
                                        (1.0 - (fVar32 - fVar2) / (fVar32 - fVar25));
                      fVar25 = fVar2;
                    }
                    fVar2 = local_a0->y;
                    if (fVar33 < fVar2) {
                      fVar31 = fVar31 + (fVar28 - fVar31) *
                                        (1.0 - (fVar29 - fVar2) / (fVar29 - fVar33));
                      fVar33 = fVar2;
                    }
                    if (fVar24 < fVar32) {
                      fVar30 = (fVar30 - fVar27) * ((fVar24 - fVar25) / (fVar32 - fVar25)) + fVar27;
                      fVar32 = fVar24;
                    }
                    fVar24 = local_a0->w;
                    if (fVar24 < fVar29) {
                      fVar28 = (fVar28 - fVar31) * ((fVar24 - fVar33) / (fVar29 - fVar33)) + fVar31;
                      fVar29 = fVar24;
                    }
                    if (fVar29 <= fVar33) {
                      local_b4 = local_b4 + fVar23;
                      bVar5 = false;
                      goto LAB_00183aa8;
                    }
                  }
                  IVar16 = (ImDrawIdx)local_60;
                  *local_80 = IVar16;
                  local_80[1] = IVar16 + 1;
                  local_80[2] = IVar16 + 2;
                  local_80[3] = IVar16;
                  local_80[4] = IVar16 + 2;
                  local_80[5] = IVar16 + 3;
                  (local_78->pos).x = fVar25;
                  (local_78->pos).y = fVar33;
                  local_78->col = local_68;
                  (local_78->uv).x = fVar27;
                  (local_78->uv).y = fVar31;
                  local_78[1].pos.x = fVar32;
                  local_78[1].pos.y = fVar33;
                  local_78[1].col = local_68;
                  local_78[1].uv.x = fVar30;
                  local_78[1].uv.y = fVar31;
                  local_78[2].pos.x = fVar32;
                  local_78[2].pos.y = fVar29;
                  local_78[2].col = local_68;
                  local_78[2].uv.x = fVar30;
                  local_78[2].uv.y = fVar28;
                  local_78[3].pos.x = fVar25;
                  local_78[3].pos.y = fVar29;
                  local_78[3].col = local_68;
                  local_78[3].uv.x = fVar27;
                  local_78[3].uv.y = fVar28;
                  local_78 = local_78 + 4;
                  local_60 = (ulong)((int)local_60 + 4);
                  local_80 = local_80 + 6;
                }
              }
            }
          }
LAB_00183aa8:
          if (bVar5) {
            local_b4 = local_b4 + fVar23;
          }
        }
        bVar5 = false;
        fVar32 = local_b4;
      }
LAB_00183ac3:
      fVar2 = local_64;
      pcVar10 = pcVar18;
      fVar27 = fVar32;
      auVar22 = (undefined1  [4])local_98;
      fVar23 = fStack_94;
      fVar24 = fStack_90;
      fVar25 = fStack_8c;
      pcVar17 = pcVar18;
      pcVar14 = pcVar20;
    } while (!bVar5);
    local_64 = fVar2;
    pIVar7 = local_78;
    pIVar6 = local_80;
    iVar19 = (int)((ulong)((long)local_78 - (long)(draw_list->VtxBuffer).Data) >> 2);
    iVar13 = iVar19 * -0x33333333;
    iVar8 = (draw_list->VtxBuffer).Capacity;
    if (SBORROW4(iVar8,iVar13) != iVar8 + iVar19 * 0x33333333 < 0) {
      if (iVar8 == 0) {
        iVar19 = 8;
      }
      else {
        iVar19 = iVar8 / 2 + iVar8;
      }
      if (iVar19 <= iVar13) {
        iVar19 = iVar13;
      }
      if (iVar8 < iVar19) {
        __dest = (ImDrawVert *)ImGui::MemAlloc((long)iVar19 * 0x14);
        __src = (draw_list->VtxBuffer).Data;
        if (__src != (ImDrawVert *)0x0) {
          memcpy(__dest,__src,(long)(draw_list->VtxBuffer).Size * 0x14);
        }
        ImGui::MemFree((draw_list->VtxBuffer).Data);
        (draw_list->VtxBuffer).Data = __dest;
        (draw_list->VtxBuffer).Capacity = iVar19;
      }
    }
    (draw_list->VtxBuffer).Size = iVar13;
    iVar8 = (draw_list->IdxBuffer).Capacity;
    iVar19 = (int)((ulong)((long)pIVar6 - (long)(draw_list->IdxBuffer).Data) >> 1);
    if (iVar8 < iVar19) {
      if (iVar8 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar8 / 2 + iVar8;
      }
      if (iVar13 <= iVar19) {
        iVar13 = iVar19;
      }
      if (iVar8 < iVar13) {
        __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar13 * 2);
        __src_00 = (draw_list->IdxBuffer).Data;
        if (__src_00 != (unsigned_short *)0x0) {
          memcpy(__dest_00,__src_00,(long)(draw_list->IdxBuffer).Size * 2);
        }
        ImGui::MemFree((draw_list->IdxBuffer).Data);
        (draw_list->IdxBuffer).Data = __dest_00;
        (draw_list->IdxBuffer).Capacity = iVar13;
      }
    }
    (draw_list->IdxBuffer).Size = iVar19;
    pIVar1 = (draw_list->CmdBuffer).Data + (long)(draw_list->CmdBuffer).Size + -1;
    pIVar1->ElemCount = pIVar1->ElemCount + (iVar19 - (local_6c + local_70));
    draw_list->_VtxWritePtr = pIVar7;
    draw_list->_IdxWritePtr = pIVar6;
    draw_list->_VtxCurrentIdx = (draw_list->VtxBuffer).Size;
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Skip non-visible lines
    const char* s = text_begin;
    if (!word_wrap_enabled && y + line_height < clip_rect.y)
        while (s < text_end && *s != '\n')  // Fast-forward to next line
            s++;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsSpace((unsigned int)c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;

                if (y > clip_rect.w)
                    break;
                if (!word_wrap_enabled && y + line_height < clip_rect.y)
                    while (s < text_end && *s != '\n')  // Fast-forward to next line
                        s++;
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const ImFontGlyph* glyph = FindGlyph((unsigned short)c))
        {
            char_width = glyph->AdvanceX * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = (unsigned int)draw_list->VtxBuffer.Size;
}